

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O3

void __thiscall validation_tests::test_assumeutxo::test_method(test_assumeutxo *this)

{
  undefined8 uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  int iVar6;
  AssumeutxoData *el;
  int *piVar7;
  long lVar8;
  undefined1 uVar9;
  int *piVar10;
  AssumeutxoData *pAVar11;
  undefined8 *puVar12;
  shared_count *psVar13;
  AssumeutxoData *pAVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  long in_FS_OFFSET;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  initializer_list<int> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar20;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  vector<int,_std::allocator<int>_> bad_heights;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> params;
  char *local_1c0;
  char *local_1b8 [2];
  assertion_result local_1a8;
  undefined1 local_190 [8];
  undefined1 local_188 [16];
  _Rb_tree_node_base _Stack_178;
  undefined1 *local_158;
  _Base_ptr local_150;
  undefined1 local_118 [8];
  undefined1 local_110 [24];
  AssumeutxoData out110_2;
  AssumeutxoData out110;
  lazy_ostream local_58;
  undefined1 *local_48;
  _Base_ptr p_Stack_40;
  _List_node_base *local_38;
  
  bVar17 = 0;
  local_38 = *(_List_node_base **)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&params,
                    (ChainType)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.args);
  out110.height = 0;
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       'd';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[1] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[2] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[3] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
       'o';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] =
       's';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       0xd1;
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10]
       = 0xd3;
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11]
       = '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12]
       = '\0';
  out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13]
       = '\0';
  __l._M_len = 6;
  __l._M_array = &out110.height;
  std::vector<int,_std::allocator<int>_>::vector(&bad_heights,__l,(allocator_type *)&out110_2);
  for (piVar10 = bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar10 !=
      bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish; piVar10 = piVar10 + 1) {
    piVar7 = *(int **)((long)params._M_t.
                             super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                             .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                      0x308);
    uVar9 = 1;
    if (piVar7 != *(int **)((long)params._M_t.
                                  super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                  .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                           0x310)) {
      do {
        if (*piVar7 == *piVar10) {
          uVar9 = 0;
          break;
        }
        piVar7 = piVar7 + 0x14;
      } while (piVar7 != *(int **)((long)params._M_t.
                                         super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                         .super__Head_base<0UL,_const_CChainParams_*,_false>.
                                         _M_head_impl + 0x310));
    }
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar20 = 0x77df3d;
    file.m_end = (iterator)0x8d;
    file.m_begin = (iterator)&local_1f0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_200,msg);
    out110_2.height._0_1_ = uVar9;
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [10] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xb] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xc] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xd] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xe] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xf] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x10] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x11] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x12] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x13] = '\0';
    _Stack_178._M_left = (_Base_ptr)0xf575df;
    _Stack_178._M_right = (_Base_ptr)0xf575e3;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _4_8_ = out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
            _M_elems._4_8_ & 0xffffffffffffff00;
    out110._0_8_ = &PTR__lazy_ostream_01389048;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _12_8_ = boost::unit_test::lazy_ostream::inst;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _20_8_ = &_Stack_178._M_left;
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_208 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&out110_2,(lazy_ostream *)&out110,1,0,WARN,_cVar20,
               (size_t)&local_210,0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.
                      m_data._M_elems + 0xc));
  }
  piVar10 = *(int **)((long)params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x308
                     );
  while( true ) {
    if (piVar10 ==
        *(int **)((long)params._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x310))
    goto LAB_0077e040;
    if (*piVar10 == 0x6e) break;
    piVar10 = piVar10 + 0x14;
  }
  pAVar11 = &out110_2;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar1 = *(undefined8 *)piVar10;
    pAVar11->height = (int)uVar1;
    (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = (char)((ulong)uVar1 >> 0x20);
    (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = (char)((ulong)uVar1 >> 0x28);
    (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = (char)((ulong)uVar1 >> 0x30);
    (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = (char)((ulong)uVar1 >> 0x38);
    piVar10 = piVar10 + (ulong)bVar17 * -4 + 2;
    pAVar11 = (AssumeutxoData *)((long)pAVar11 + (ulong)bVar17 * -0x10 + 8);
  }
LAB_0077e040:
  pAVar11 = &out110_2;
  pAVar14 = &out110;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar2 = (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
            _M_elems[0];
    uVar3 = (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
            _M_elems[1];
    uVar4 = (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
            _M_elems[2];
    uVar5 = (pAVar11->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
            _M_elems[3];
    pAVar14->height = pAVar11->height;
    (pAVar14->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = uVar2;
    (pAVar14->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = uVar3;
    (pAVar14->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = uVar4;
    (pAVar14->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = uVar5;
    pAVar11 = (AssumeutxoData *)((long)pAVar11 + (ulong)bVar17 * -0x10 + 8);
    pAVar14 = (AssumeutxoData *)((long)pAVar14 + (ulong)bVar17 * -0x10 + 8);
  }
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x91;
  file_00.m_begin = (iterator)&local_220;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
             msg_00);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_48 = boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_118,&out110.hash_serialized);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_118,
                     "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
  local_188[0] = iVar6 == 0;
  local_188._8_8_ = (element_type *)0x0;
  _Stack_178._0_8_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1a8.m_message.px = (element_type *)0xf57489;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _4_8_ = out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
          _M_elems._5_8_ << 8;
  out110_2._0_8_ = &PTR__lazy_ostream_01388fc8;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _12_8_ = boost::unit_test::lazy_ostream::inst;
  local_150 = (_Base_ptr)local_190;
  local_190 = (undefined1  [8])0xf57606;
  _Stack_178._M_right = (_Base_ptr)((ulong)_Stack_178._M_right & 0xffffffffffffff00);
  _Stack_178._M_left = (_Base_ptr)&PTR__lazy_ostream_013898d8;
  local_158 = boost::unit_test::lazy_ostream::inst;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_1b8[0] = (char *)local_118;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _20_8_ = (_Base_ptr)local_1b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,&local_58,1,2,REQUIRE,0xf575e4,(size_t)&local_1a8,0x91,
             &out110_2,"\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"",
             (shared_count *)&_Stack_178._M_left);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_178);
  if (local_118 != (undefined1  [8])(local_110 + 8)) {
    operator_delete((void *)local_118,local_110._8_8_ + 1);
  }
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x92;
  file_01.m_begin = (iterator)&local_240;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_250,
             msg_01);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_48 = boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)0xf4aea1;
  local_1a8._0_8_ = &out110.m_chain_tx_count;
  local_190._0_4_ = 0x6f;
  local_118[0] = out110.m_chain_tx_count == 0x6f;
  local_110._0_8_ = (element_type *)0x0;
  local_110._8_8_ = (sp_counted_base *)0x0;
  local_188._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_188._8_8_ = "";
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _4_8_ = out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
          _M_elems._5_8_ << 8;
  out110_2._0_8_ = &PTR__lazy_ostream_01388f48;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _12_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8[0] = local_190;
  _Stack_178._M_right = (_Base_ptr)((ulong)_Stack_178._M_right & 0xffffffffffffff00);
  _Stack_178._M_left = (_Base_ptr)&PTR__lazy_ostream_01388f88;
  local_158 = boost::unit_test::lazy_ostream::inst;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_150 = (_Base_ptr)local_1b8;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _20_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,&local_58,1,2,REQUIRE,0xf5768a,(size_t)local_188,0x92,
             &out110_2,"111U",(shared_count *)&_Stack_178._M_left);
  boost::detail::shared_count::~shared_count((shared_count *)(local_110 + 8));
  local_58._vptr_lazy_ostream = (_func_int **)0x98c0aec0ab50425c;
  local_58._8_8_ = 0x4105647a3c4fd9f2;
  local_48 = (undefined1 *)0x7ee134edceeeeaaa;
  p_Stack_40 = (_Base_ptr)0x696e92821f65549c;
  puVar12 = *(undefined8 **)
             ((long)params._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x308);
  while( true ) {
    if (puVar12 ==
        *(undefined8 **)
         ((long)params._M_t.
                super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
                _M_t.
                super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x310))
    goto LAB_0077e3d7;
    auVar19[0] = -(*(char *)(puVar12 + 8) == -0x56);
    auVar19[1] = -(*(char *)((long)puVar12 + 0x41) == -0x16);
    auVar19[2] = -(*(char *)((long)puVar12 + 0x42) == -0x12);
    auVar19[3] = -(*(char *)((long)puVar12 + 0x43) == -0x32);
    auVar19[4] = -(*(char *)((long)puVar12 + 0x44) == -0x13);
    auVar19[5] = -(*(char *)((long)puVar12 + 0x45) == '4');
    auVar19[6] = -(*(char *)((long)puVar12 + 0x46) == -0x1f);
    auVar19[7] = -(*(char *)((long)puVar12 + 0x47) == '~');
    auVar19[8] = -(*(char *)(puVar12 + 9) == -100);
    auVar19[9] = -(*(char *)((long)puVar12 + 0x49) == 'T');
    auVar19[10] = -(*(char *)((long)puVar12 + 0x4a) == 'e');
    auVar19[0xb] = -(*(char *)((long)puVar12 + 0x4b) == '\x1f');
    auVar19[0xc] = -(*(char *)((long)puVar12 + 0x4c) == -0x7e);
    auVar19[0xd] = -(*(char *)((long)puVar12 + 0x4d) == -0x6e);
    auVar19[0xe] = -(*(char *)((long)puVar12 + 0x4e) == 'n');
    auVar19[0xf] = -(*(char *)((long)puVar12 + 0x4f) == 'i');
    auVar18[0] = -(*(char *)(puVar12 + 6) == '\\');
    auVar18[1] = -(*(char *)((long)puVar12 + 0x31) == 'B');
    auVar18[2] = -(*(char *)((long)puVar12 + 0x32) == 'P');
    auVar18[3] = -(*(char *)((long)puVar12 + 0x33) == -0x55);
    auVar18[4] = -(*(char *)((long)puVar12 + 0x34) == -0x40);
    auVar18[5] = -(*(char *)((long)puVar12 + 0x35) == -0x52);
    auVar18[6] = -(*(char *)((long)puVar12 + 0x36) == -0x40);
    auVar18[7] = -(*(char *)((long)puVar12 + 0x37) == -0x68);
    auVar18[8] = -(*(char *)(puVar12 + 7) == -0xe);
    auVar18[9] = -(*(char *)((long)puVar12 + 0x39) == -0x27);
    auVar18[10] = -(*(char *)((long)puVar12 + 0x3a) == 'O');
    auVar18[0xb] = -(*(char *)((long)puVar12 + 0x3b) == '<');
    auVar18[0xc] = -(*(char *)((long)puVar12 + 0x3c) == 'z');
    auVar18[0xd] = -(*(char *)((long)puVar12 + 0x3d) == 'd');
    auVar18[0xe] = -(*(char *)((long)puVar12 + 0x3e) == '\x05');
    auVar18[0xf] = -(*(char *)((long)puVar12 + 0x3f) == 'A');
    auVar18 = auVar18 & auVar19;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) break;
    puVar12 = puVar12 + 10;
  }
  psVar13 = (shared_count *)&_Stack_178._M_left;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar13->pi_ = (sp_counted_base *)*puVar12;
    puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
    psVar13 = psVar13 + (ulong)bVar17 * -2 + 1;
  }
LAB_0077e3d7:
  psVar13 = (shared_count *)&_Stack_178._M_left;
  pAVar11 = &out110_2;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(sp_counted_base **)pAVar11 = psVar13->pi_;
    psVar13 = psVar13 + (ulong)bVar17 * -2 + 1;
    pAVar11 = (AssumeutxoData *)((long)pAVar11 + (ulong)bVar17 * -0x10 + 8);
  }
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x95;
  file_02.m_begin = (iterator)&local_260;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
             msg_02);
  local_110._0_8_ = local_110._1_8_ << 8;
  local_118 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_110._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_110._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_188,&out110_2.hash_serialized);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar6 == 0);
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1b8[1] = "";
  _Stack_178._M_right = (_Base_ptr)((ulong)_Stack_178._M_right & 0xffffffffffffff00);
  _Stack_178._M_left = (_Base_ptr)&PTR__lazy_ostream_01388fc8;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (_Base_ptr)local_190;
  local_1c0 = "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013898d8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  local_190 = (undefined1  [8])local_188;
  p_Stack_40 = (_Base_ptr)&local_1c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,(lazy_ostream *)local_118,1,2,REQUIRE,0xf576a7,(size_t)local_1b8,0x95,
             (shared_count *)&_Stack_178._M_left,
             "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"",&local_58);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  if ((_Base_ptr)local_188._0_8_ != &_Stack_178) {
    operator_delete((void *)local_188._0_8_,(ulong)((long)(_func_int ***)_Stack_178._0_8_ + 1));
  }
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_280;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_290,
             msg_03);
  local_110._0_8_ = local_110._1_8_ << 8;
  local_118 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_110._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_110._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b8[0] = (char *)&out110_2.m_chain_tx_count;
  local_188[0] = out110_2.m_chain_tx_count == 0x6f;
  local_1c0 = (char *)CONCAT44(local_1c0._4_4_,0x6f);
  local_188._8_8_ = (element_type *)0x0;
  _Stack_178._0_8_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1a8.m_message.px = (element_type *)0xf57489;
  _Stack_178._M_right = (_Base_ptr)((ulong)_Stack_178._M_right & 0xffffffffffffff00);
  _Stack_178._M_left = (_Base_ptr)&PTR__lazy_ostream_01388f48;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f88;
  local_48 = boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)local_190;
  local_190 = (undefined1  [8])&local_1c0;
  local_150 = (_Base_ptr)local_1b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_118,1,2,REQUIRE,0xf576cb,
             (size_t)&local_1a8,0x96,(shared_count *)&_Stack_178._M_left,"111U",&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_178);
  if (bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&params);
  if (*(_List_node_base **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_assumeutxo)
{
    const auto params = CreateChainParams(*m_node.args, ChainType::REGTEST);

    // These heights don't have assumeutxo configurations associated, per the contents
    // of kernel/chainparams.cpp.
    std::vector<int> bad_heights{0, 100, 111, 115, 209, 211};

    for (auto empty : bad_heights) {
        const auto out = params->AssumeutxoForHeight(empty);
        BOOST_CHECK(!out);
    }

    const auto out110 = *params->AssumeutxoForHeight(110);
    BOOST_CHECK_EQUAL(out110.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110.m_chain_tx_count, 111U);

    const auto out110_2 = *params->AssumeutxoForBlockhash(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"});
    BOOST_CHECK_EQUAL(out110_2.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110_2.m_chain_tx_count, 111U);
}